

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genMaxMinValues_abi_cxx11_
          (CppGenerator *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *varOrder)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Attribute *__rhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  TreeDecomposition *in_RDI;
  Attribute *attr;
  size_t var;
  string *returnString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TreeDecomposition *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  CppGenerator *in_stack_fffffffffffffea8;
  Type in_stack_fffffffffffffeb4;
  CppGenerator *in_stack_fffffffffffffeb8;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  Attribute *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  allocator local_1a;
  undefined1 local_19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (__lhs = local_38,
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18),
        __lhs < pbVar1) {
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2e384d);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (local_18,(size_type)local_38);
    __rhs = TreeDecomposition::getAttribute(this_00,(size_t)__lhs);
    local_40 = __rhs;
    offset_abi_cxx11_(in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
    typeToStr_abi_cxx11_(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
    std::__cxx11::string::~string(local_140);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_38->field_0x1;
  }
  return (string *)this_00;
}

Assistant:

std::string CppGenerator::genMaxMinValues(const std::vector<size_t>& varOrder)
{
    std::string returnString = "";
    for (size_t var = 0; var < varOrder.size(); ++var)
    {
        Attribute* attr = _td->getAttribute(varOrder[var]);
        returnString += offset(2)+typeToStr(attr->_type)+" min_"+attr->_name+", "+
            "max_"+attr->_name+";\n";
    }
    return returnString;
}